

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

ConstPixelBufferAccess * __thiscall
sglr::ReferenceContext::getUnpack3DAccess
          (ConstPixelBufferAccess *__return_storage_ptr__,ReferenceContext *this,
          TextureFormat *format,int width,int height,int depth,void *data)

{
  int iVar1;
  deInt32 rowPitch_00;
  int local_68;
  int local_64;
  deUint8 *ptr;
  int slicePitch;
  int rowPitch;
  int imageHeight;
  int rowLen;
  int pixelSize;
  int depth_local;
  int height_local;
  int width_local;
  TextureFormat *format_local;
  ReferenceContext *this_local;
  
  iVar1 = tcu::TextureFormat::getPixelSize(format);
  local_64 = width;
  if (0 < this->m_pixelUnpackRowLength) {
    local_64 = this->m_pixelUnpackRowLength;
  }
  local_68 = height;
  if (0 < this->m_pixelUnpackImageHeight) {
    local_68 = this->m_pixelUnpackImageHeight;
  }
  rowPitch_00 = deAlign32(local_64 * iVar1,this->m_pixelUnpackAlignment);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,format,width,height,depth,rowPitch_00,local_68 * rowPitch_00,
             (void *)((long)data +
                     (long)(this->m_pixelUnpackSkipPixels * iVar1) +
                     (long)(this->m_pixelUnpackSkipRows * rowPitch_00) +
                     (long)(this->m_pixelUnpackSkipImages * local_68 * rowPitch_00)));
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess ReferenceContext::getUnpack3DAccess (const tcu::TextureFormat& format, int width, int height, int depth, const void* data)
{
	int				pixelSize	= format.getPixelSize();
	int				rowLen		= m_pixelUnpackRowLength	> 0 ? m_pixelUnpackRowLength	: width;
	int				imageHeight	= m_pixelUnpackImageHeight	> 0 ? m_pixelUnpackImageHeight	: height;
	int				rowPitch	= deAlign32(rowLen*pixelSize, m_pixelUnpackAlignment);
	int				slicePitch	= imageHeight*rowPitch;
	const deUint8*	ptr			= (const deUint8*)data + m_pixelUnpackSkipImages*slicePitch + m_pixelUnpackSkipRows*rowPitch + m_pixelUnpackSkipPixels*pixelSize;

	return tcu::ConstPixelBufferAccess(format, width, height, depth, rowPitch, slicePitch, ptr);
}